

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O2

int parse_args_TEXLD(Context *ctx)

{
  int iVar1;
  
  iVar1 = shader_version_atleast(ctx,'\x02','\0');
  if (iVar1 != 0) {
    iVar1 = parse_args_DSS(ctx);
    return iVar1;
  }
  iVar1 = shader_version_atleast(ctx,'\x01','\x04');
  if (iVar1 != 0) {
    iVar1 = parse_args_DS(ctx);
    return iVar1;
  }
  iVar1 = parse_args_D(ctx);
  return iVar1;
}

Assistant:

static int parse_args_TEXLD(Context *ctx)
{
    // different registers in px_1_3, ps_1_4, and ps_2_0!
    if (shader_version_atleast(ctx, 2, 0))
        return parse_args_DSS(ctx);
    else if (shader_version_atleast(ctx, 1, 4))
        return parse_args_DS(ctx);
    return parse_args_D(ctx);
}